

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_ptr.hpp
# Opt level: O2

void __thiscall
boost::shared_ptr<boost::runtime::basic_param>::shared_ptr<boost::runtime::option>
          (shared_ptr<boost::runtime::basic_param> *this,option *p)

{
  this->px = &p->super_basic_param;
  (this->pn).pi_ = (sp_counted_base *)0x0;
  detail::sp_pointer_construct<boost::runtime::basic_param,boost::runtime::option>(this,p,&this->pn)
  ;
  return;
}

Assistant:

explicit shared_ptr( Y * p ): px( p ), pn() // Y must be complete
    {
        boost::detail::sp_pointer_construct( this, p, pn );
    }